

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::BinaryBlockEventExpressionSyntax::setChild
          (BinaryBlockEventExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->right).ptr = (BlockEventExpressionSyntax *)pSVar1;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->orKeyword).kind = TVar2.kind;
    (this->orKeyword).field_0x2 = TVar2._2_1_;
    (this->orKeyword).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->orKeyword).rawLen = TVar2.rawLen;
    (this->orKeyword).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->left).ptr = (BlockEventExpressionSyntax *)pSVar1;
  }
  return;
}

Assistant:

void BinaryBlockEventExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<BlockEventExpressionSyntax>() : nullptr; return;
        case 1: orKeyword = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<BlockEventExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}